

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O0

void __thiscall
rw_executor<booster::recursive_shared_mutex>::operator()
          (rw_executor<booster::recursive_shared_mutex> *this)

{
  undefined8 *in_RDI;
  longlong unaff_retaddr;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 0x14; iVar1 = iVar1 + 1) {
    if ((*(byte *)(in_RDI + 1) & 1) == 0) {
      booster::recursive_shared_mutex::unique_lock();
      *(undefined1 *)*in_RDI = 1;
      booster::ptime::millisleep(unaff_retaddr);
      *(undefined1 *)*in_RDI = 0;
      booster::recursive_shared_mutex::unlock();
    }
    else {
      booster::recursive_shared_mutex::shared_lock();
      std::mutex::lock((mutex *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      *(undefined1 *)*in_RDI = 1;
      std::mutex::unlock((mutex *)0x11311c);
      booster::ptime::millisleep(unaff_retaddr);
      std::mutex::lock((mutex *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      *(undefined1 *)*in_RDI = 0;
      std::mutex::unlock((mutex *)0x113146);
      booster::recursive_shared_mutex::unlock();
    }
  }
  return;
}

Assistant:

void operator()() const
	{
		for(int i=0;i<20;i++) {
			if(read) {
				mutex->shared_lock();
				{
					flags_mutex->lock();
					*flag = true;
					flags_mutex->unlock();
				}
				booster::ptime::millisleep(5);
				{
					flags_mutex->lock();
					*flag = false;
					flags_mutex->unlock();
				}
				mutex->unlock();
			}
			else {
				mutex->unique_lock();
				*flag = true;
				booster::ptime::millisleep(5);
				*flag = false;
				mutex->unlock();
			}
		}
	}